

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::CopyIterator
          (TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          MapIterator *this_iter,MapIterator *that_iter)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  CppType type;
  
  puVar1 = (undefined8 *)that_iter->iter_;
  puVar2 = (undefined8 *)this_iter->iter_;
  puVar2[2] = puVar1[2];
  uVar3 = puVar1[1];
  *puVar2 = *puVar1;
  puVar2[1] = uVar3;
  type = MapKey::type(&that_iter->key_);
  MapKey::SetType(&this_iter->key_,type);
  (this_iter->value_).super_MapValueConstRef.type_ =
       (that_iter->value_).super_MapValueConstRef.type_;
  (*(this->super_MapFieldBase)._vptr_MapFieldBase[0x17])(this,this_iter);
  return;
}

Assistant:

void TypeDefinedMapFieldBase<Key, T>::CopyIterator(
    MapIterator* this_iter, const MapIterator& that_iter) const {
  InternalGetIterator(this_iter) = InternalGetIterator(&that_iter);
  this_iter->key_.SetType(that_iter.key_.type());
  // MapValueRef::type() fails when containing data is null. However, if
  // this_iter points to MapEnd, data can be null.
  this_iter->value_.SetType(
      static_cast<FieldDescriptor::CppType>(that_iter.value_.type_));
  SetMapIteratorValue(this_iter);
}